

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

bool jsoncons::detail::dtoa_general<jsoncons::string_sink<std::__cxx11::string>>
               (double v,char decimal_point,
               string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *result)

{
  bool bVar1;
  int k;
  int length;
  char buffer [100];
  int local_90;
  int local_8c;
  double local_88;
  char local_78 [104];
  
  if ((v != 0.0) || (NAN(v))) {
    local_8c = 0;
    local_88 = v;
    bVar1 = grisu3(ABS(v),local_78,&local_8c,&local_90);
    if (!bVar1) {
      bVar1 = dtoa_general<jsoncons::string_sink<std::__cxx11::string>>
                        (local_88,(int)decimal_point,result);
      return bVar1;
    }
    if ((long)local_88 < 0) {
      std::__cxx11::string::push_back((char)result->buf_ptr);
    }
    prettify_string<jsoncons::string_sink<std::__cxx11::string>>
              (local_78,(long)local_8c,local_90,-4,0x11,result);
  }
  else {
    std::__cxx11::string::push_back((char)result->buf_ptr);
    std::__cxx11::string::push_back((char)result->buf_ptr);
    std::__cxx11::string::push_back((char)result->buf_ptr);
  }
  return true;
}

Assistant:

bool dtoa_general(double v, char decimal_point, Result& result, std::true_type)
    {
        if (v == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        int length = 0;
        int k;

        char buffer[100];

        double u = std::signbit(v) ? -v : v;
        if (jsoncons::detail::grisu3(u, buffer, &length, &k))
        {
            if (std::signbit(v))
            {
                result.push_back('-');
            }
            // min exp: -4 is consistent with sprintf
            // max exp: std::numeric_limits<double>::max_digits10
            jsoncons::detail::prettify_string(buffer, length, k, -4, std::numeric_limits<double>::max_digits10, result);
            return true;
        }
        else
        {
            return dtoa_general(v, decimal_point, result, std::false_type());
        }
    }